

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3MemCompare(Mem *pMem1,Mem *pMem2,CollSeq *pColl)

{
  double dVar1;
  ushort uVar2;
  ushort uVar3;
  double dVar4;
  ushort uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  bool bVar11;
  bool bVar12;
  
  uVar2 = pMem1->flags;
  uVar3 = pMem2->flags;
  uVar5 = uVar3 | uVar2;
  if ((uVar5 & 1) != 0) {
    return (uVar3 & 1) - (uVar2 & 1);
  }
  if ((uVar5 & 0xc) == 0) {
    if ((uVar5 & 2) != 0) {
      if ((uVar2 & 2) == 0) {
        return 1;
      }
      if ((uVar3 & 2) == 0) {
        return -1;
      }
      if (pColl != (CollSeq *)0x0) {
        iVar6 = vdbeCompareMemString(pMem1,pMem2,pColl,(u8 *)0x0);
        return iVar6;
      }
      iVar6 = sqlite3BlobCompare(pMem1,pMem2);
      return iVar6;
    }
    iVar9 = pMem1->n;
    iVar6 = pMem2->n;
    uVar2 = pMem1->flags;
    if (((pMem2->flags | uVar2) >> 0xe & 1) == 0) {
      iVar8 = iVar6;
      if (iVar9 < iVar6) {
        iVar8 = iVar9;
      }
      iVar8 = memcmp(pMem1->z,pMem2->z,(long)iVar8);
      if (iVar8 == 0) {
        return iVar9 - iVar6;
      }
      return iVar8;
    }
    if ((uVar2 & 0x4000 & pMem2->flags) == 0) {
      if ((uVar2 & 0x4000) != 0) {
        iVar9 = isAllZero(pMem2->z,iVar6);
        if (iVar9 == 0) {
          return -1;
        }
        return (pMem1->u).nZero - iVar6;
      }
      iVar6 = isAllZero(pMem1->z,iVar9);
      if (iVar6 == 0) {
        return 1;
      }
    }
    else {
      iVar9 = (pMem1->u).nZero;
    }
    return iVar9 - (pMem2->u).nZero;
  }
  if ((uVar3 & uVar2 & 4) == 0) {
    if ((uVar3 & uVar2 & 8) == 0) {
      if ((uVar2 & 4) == 0) {
        if ((uVar2 & 8) == 0) {
          return 1;
        }
        if ((uVar3 & 4) != 0) {
          dVar4 = (double)(pMem2->u).i;
          dVar1 = (pMem1->u).r;
          uVar10 = -(uint)(dVar1 < dVar4);
          bVar12 = dVar1 == dVar4;
          bVar11 = dVar1 < dVar4;
          uVar7 = 1;
LAB_001450c0:
          if (bVar11 || bVar12) {
            uVar7 = uVar10;
          }
          return uVar7;
        }
      }
      else if ((uVar3 & 8) != 0) {
        dVar4 = (double)(pMem1->u).i;
        dVar1 = (pMem2->u).r;
        uVar10 = (uint)(dVar1 < dVar4);
        bVar12 = dVar1 == dVar4;
        bVar11 = dVar1 < dVar4;
        uVar7 = 0xffffffff;
        goto LAB_001450c0;
      }
    }
    else if ((pMem2->u).r <= (pMem1->u).r) {
      return (int)((pMem2->u).r < (pMem1->u).r);
    }
  }
  else if ((pMem2->u).i <= (pMem1->u).i) {
    return (int)((pMem2->u).i < (pMem1->u).i);
  }
  return -1;
}

Assistant:

SQLITE_PRIVATE int sqlite3MemCompare(const Mem *pMem1, const Mem *pMem2, const CollSeq *pColl){
  int f1, f2;
  int combined_flags;

  f1 = pMem1->flags;
  f2 = pMem2->flags;
  combined_flags = f1|f2;
  assert( !sqlite3VdbeMemIsRowSet(pMem1) && !sqlite3VdbeMemIsRowSet(pMem2) );
 
  /* If one value is NULL, it is less than the other. If both values
  ** are NULL, return 0.
  */
  if( combined_flags&MEM_Null ){
    return (f2&MEM_Null) - (f1&MEM_Null);
  }

  /* At least one of the two values is a number
  */
  if( combined_flags&(MEM_Int|MEM_Real) ){
    if( (f1 & f2 & MEM_Int)!=0 ){
      if( pMem1->u.i < pMem2->u.i ) return -1;
      if( pMem1->u.i > pMem2->u.i ) return +1;
      return 0;
    }
    if( (f1 & f2 & MEM_Real)!=0 ){
      if( pMem1->u.r < pMem2->u.r ) return -1;
      if( pMem1->u.r > pMem2->u.r ) return +1;
      return 0;
    }
    if( (f1&MEM_Int)!=0 ){
      if( (f2&MEM_Real)!=0 ){
        return sqlite3IntFloatCompare(pMem1->u.i, pMem2->u.r);
      }else{
        return -1;
      }
    }
    if( (f1&MEM_Real)!=0 ){
      if( (f2&MEM_Int)!=0 ){
        return -sqlite3IntFloatCompare(pMem2->u.i, pMem1->u.r);
      }else{
        return -1;
      }
    }
    return +1;
  }

  /* If one value is a string and the other is a blob, the string is less.
  ** If both are strings, compare using the collating functions.
  */
  if( combined_flags&MEM_Str ){
    if( (f1 & MEM_Str)==0 ){
      return 1;
    }
    if( (f2 & MEM_Str)==0 ){
      return -1;
    }

    assert( pMem1->enc==pMem2->enc || pMem1->db->mallocFailed );
    assert( pMem1->enc==SQLITE_UTF8 || 
            pMem1->enc==SQLITE_UTF16LE || pMem1->enc==SQLITE_UTF16BE );

    /* The collation sequence must be defined at this point, even if
    ** the user deletes the collation sequence after the vdbe program is
    ** compiled (this was not always the case).
    */
    assert( !pColl || pColl->xCmp );

    if( pColl ){
      return vdbeCompareMemString(pMem1, pMem2, pColl, 0);
    }
    /* If a NULL pointer was passed as the collate function, fall through
    ** to the blob case and use memcmp().  */
  }
 
  /* Both values must be blobs.  Compare using memcmp().  */
  return sqlite3BlobCompare(pMem1, pMem2);
}